

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_ImageSectionStream.cpp
# Opt level: O0

uint32_t __thiscall
PDB::ImageSectionStream::ConvertSectionOffsetToRVA
          (ImageSectionStream *this,uint16_t oneBasedSectionIndex,uint32_t offsetInSection)

{
  uint32_t offsetInSection_local;
  uint16_t oneBasedSectionIndex_local;
  ImageSectionStream *this_local;
  
  if (oneBasedSectionIndex == 0) {
    this_local._4_4_ = 0;
  }
  else if (this->m_count < (ulong)oneBasedSectionIndex) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = this->m_headers[oneBasedSectionIndex - 1].VirtualAddress + offsetInSection;
  }
  return this_local._4_4_;
}

Assistant:

PDB_NO_DISCARD uint32_t PDB::ImageSectionStream::ConvertSectionOffsetToRVA(uint16_t oneBasedSectionIndex, uint32_t offsetInSection) const PDB_NO_EXCEPT
{
	if (oneBasedSectionIndex == 0u)
	{
		// should never happen, but prevent underflow
		return 0u;
	}
	else if (oneBasedSectionIndex > m_count)
	{
		// this symbol is "contained" in a section that is neither part of the PDB, nor the EXE.
		// it is a special compiler-generated or linker-generated symbol such as CFG symbols (e.g. __guard_fids_count, __guard_flags).
		// we can safely ignore those symbols.
		return 0u;
	}

	return m_headers[oneBasedSectionIndex - 1u].VirtualAddress + offsetInSection;
}